

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_cipher_generate_iv
          (psa_cipher_operation_t *operation,uint8_t *iv,size_t iv_size,size_t *iv_length)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = -0x89;
  if ((operation->field_0x4 & 6) == 2) {
    iVar2 = -0x8a;
    if (operation->iv_size <= iv_size) {
      iVar2 = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,iv,(ulong)operation->iv_size);
      if (iVar2 == 0) {
        bVar1 = operation->iv_size;
        *iv_length = (ulong)bVar1;
        iVar2 = psa_cipher_set_iv(operation,iv,(ulong)bVar1);
      }
      else {
        iVar2 = mbedtls_to_psa_error(iVar2);
      }
      if (iVar2 == 0) {
        return 0;
      }
    }
    psa_cipher_abort(operation);
  }
  return iVar2;
}

Assistant:

psa_status_t psa_cipher_generate_iv( psa_cipher_operation_t *operation,
                                     uint8_t *iv,
                                     size_t iv_size,
                                     size_t *iv_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if( operation->iv_set || ! operation->iv_required )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( iv_size < operation->iv_size )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }
    ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg,
                                   iv, operation->iv_size );
    if( ret != 0 )
    {
        status = mbedtls_to_psa_error( ret );
        goto exit;
    }

    *iv_length = operation->iv_size;
    status = psa_cipher_set_iv( operation, iv, *iv_length );

exit:
    if( status != PSA_SUCCESS )
        psa_cipher_abort( operation );
    return( status );
}